

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_quicblock(void)

{
  uint8_t *puVar1;
  undefined8 *puVar2;
  short *psVar3;
  int iVar4;
  uint64_t uVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  short *__ptr;
  uint8_t *_src;
  short *local_58;
  ptls_buffer_t local_50;
  
  local_50.base = "";
  local_50.capacity = 0;
  local_50.off = 0;
  local_50.is_allocated = 0;
  iVar4 = ptls_buffer_reserve(&local_50,1);
  sVar7 = local_50.off;
  __ptr = (short *)local_50.base;
  if (iVar4 == 0) {
    *(undefined1 *)((long)local_50.base + local_50.off) = 0;
    sVar6 = local_50.off + 1;
    local_50.off = sVar6;
    iVar4 = ptls_buffer_reserve(&local_50,3);
    sVar7 = local_50.off;
    __ptr = (short *)local_50.base;
    if (iVar4 == 0) {
      *(undefined1 *)((long)local_50.base + local_50.off + 2) = 99;
      *(undefined2 *)((long)local_50.base + local_50.off) = 0x6261;
      local_50.off = local_50.off + 3;
      iVar4 = ptls_buffer__adjust_quic_blocksize(&local_50,local_50.off - sVar6);
      sVar7 = local_50.off;
      __ptr = (short *)local_50.base;
      if (iVar4 == 0) {
        puVar1 = (uint8_t *)((long)local_50.base + local_50.off);
        local_58 = (short *)local_50.base;
        uVar5 = ptls_decode_quicint((uint8_t **)&local_58,puVar1);
        psVar3 = local_58;
        if (uVar5 <= (ulong)((long)puVar1 - (long)local_58) && uVar5 != 0xffffffffffffffff) {
          _ok((uint)(uVar5 == 3),"%s %d",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
              ,0x5ea);
          _ok((uint)((char)psVar3[1] == 'c' && *psVar3 == 0x6261),"%s %d",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
              ,0x5eb);
          if (uVar5 == 3 && (uint8_t *)((long)psVar3 + 3) == puVar1) {
            local_50.off = 0;
            iVar4 = ptls_buffer_reserve(&local_50,1);
            sVar7 = local_50.off;
            __ptr = (short *)local_50.base;
            if (iVar4 == 0) {
              *(undefined1 *)((long)local_50.base + local_50.off) = 0;
              sVar6 = local_50.off + 1;
              local_50.off = sVar6;
              iVar4 = ptls_buffer_reserve(&local_50,0x7b);
              sVar7 = local_50.off;
              __ptr = (short *)local_50.base;
              if (iVar4 == 0) {
                puVar2 = (undefined8 *)((long)local_50.base + local_50.off + 0x6b);
                *puVar2 = 0x5555555555555555;
                puVar2[1] = 0x5555555555555555;
                puVar2 = (undefined8 *)((long)local_50.base + local_50.off + 0x60);
                *puVar2 = 0x5555555555555555;
                puVar2[1] = 0x5555555555555555;
                puVar2 = (undefined8 *)((long)local_50.base + local_50.off + 0x50);
                *puVar2 = 0x5555555555555555;
                puVar2[1] = 0x5555555555555555;
                puVar2 = (undefined8 *)((long)local_50.base + local_50.off + 0x40);
                *puVar2 = 0x5555555555555555;
                puVar2[1] = 0x5555555555555555;
                puVar2 = (undefined8 *)((long)local_50.base + local_50.off + 0x30);
                *puVar2 = 0x5555555555555555;
                puVar2[1] = 0x5555555555555555;
                puVar2 = (undefined8 *)((long)local_50.base + local_50.off + 0x20);
                *puVar2 = 0x5555555555555555;
                puVar2[1] = 0x5555555555555555;
                puVar2 = (undefined8 *)((long)local_50.base + local_50.off + 0x10);
                *puVar2 = 0x5555555555555555;
                puVar2[1] = 0x5555555555555555;
                *(undefined8 *)((long)local_50.base + local_50.off) = 0x5555555555555555;
                ((undefined8 *)((long)local_50.base + local_50.off))[1] = 0x5555555555555555;
                local_50.off = local_50.off + 0x7b;
                iVar4 = ptls_buffer__adjust_quic_blocksize(&local_50,local_50.off - sVar6);
                sVar7 = local_50.off;
                __ptr = (short *)local_50.base;
                if (iVar4 == 0) {
                  puVar1 = (uint8_t *)((long)local_50.base + local_50.off);
                  local_58 = (short *)local_50.base;
                  uVar5 = ptls_decode_quicint((uint8_t **)&local_58,puVar1);
                  psVar3 = local_58;
                  if (uVar5 <= (ulong)((long)puVar1 - (long)local_58) && uVar5 != 0xffffffffffffffff
                     ) {
                    _ok((uint)(uVar5 == 0x7b),"%s %d",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                        ,0x5f9);
                    lVar8 = 0;
                    do {
                      _ok((uint)(*(char *)((long)psVar3 + lVar8) == 'U'),"%s %d",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                          ,0x5fc);
                      lVar8 = lVar8 + 1;
                    } while (lVar8 != 0x7b);
                    if ((uint8_t *)((long)psVar3 + 0x7b) == puVar1 && uVar5 == 0x7b)
                    goto LAB_00121002;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  _ok(0,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x601)
  ;
LAB_00121002:
  (*ptls_clear_memory)(__ptr,sVar7);
  if (local_50.is_allocated == 0) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

static void test_quicblock(void)
{
    ptls_buffer_t buf;
    const uint8_t *src, *end;
    int ret;

    ptls_buffer_init(&buf, "", 0);

    ptls_buffer_push_block(&buf, -1, { ptls_buffer_pushv(&buf, "abc", 3); });
    src = buf.base;
    end = buf.base + buf.off;
    ptls_decode_block(src, end, -1, {
        ok(end - src == 3);
        ok(memcmp(src, "abc", 3) == 0);
        src += 3;
    });

    buf.off = 0;
    ptls_buffer_push_block(&buf, -1, {
        if ((ret = ptls_buffer_reserve(&buf, 123)) != 0)
            goto Exit;
        memset(buf.base + buf.off, 0x55, 123);
        buf.off += 123;
    });
    src = buf.base;
    end = buf.base + buf.off;
    ptls_decode_block(src, end, -1, {
        ok(end - src == 123);
        size_t i;
        for (i = 0; i != 123; ++i)
            ok(*src++ == 0x55);
    });

Exit:
    if (ret != 0)
        ok(!"fail");
    ptls_buffer_dispose(&buf);
}